

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O2

void __thiscall Serializer_Operator1_Test::TestBody(Serializer_Operator1_Test *this)

{
  Serializer *pSVar1;
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_78;
  string local_60;
  AssertionResult gtest_ar;
  Serializer builder;
  
  cfd::core::Serializer::Serializer(&builder);
  pSVar1 = cfd::core::Serializer::operator<<(&builder,1);
  pSVar1 = cfd::core::Serializer::operator<<(pSVar1,2);
  cfd::core::Serializer::operator<<(pSVar1,'\x03');
  cfd::core::Serializer::AddVariableInt(&builder,0x1ffff);
  std::__cxx11::string::string((string *)&local_60,"f1f2",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&_Stack_78,&local_60);
  cfd::core::Serializer::AddVariableBuffer(&builder,(ByteData *)&_Stack_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"d1d2d3d4",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&_Stack_78,&local_60);
  cfd::core::Serializer::AddPrefixBuffer(&builder,0xe1e2e3e4,(ByteData *)&_Stack_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"c1c2c3c4",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData((ByteData *)&_Stack_78,&local_60);
  cfd::core::Serializer::operator<<(&builder,(ByteData *)&_Stack_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::Serializer::Output((ByteData *)&_Stack_78,&builder);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,(ByteData *)&_Stack_78);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex().c_str()",
             "01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
             local_60._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_Stack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Serializer::~Serializer(&builder);
  return;
}

Assistant:

TEST(Serializer, Operator1) {
  Serializer builder;
  builder << uint32_t{1} << uint64_t{2} << uint8_t{3};
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder << ByteData("c1c2c3c4");

  EXPECT_STREQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex().c_str());
}